

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

bool __thiscall
deqp::gls::FboUtil::ValidStatusCodes::isErrorCodeValid(ValidStatusCodes *this,GLenum errorCode)

{
  GLenum *pGVar1;
  int iVar2;
  ulong uVar3;
  pointer pRVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (errorCode == 0) {
    return (this->m_errorCodes).
           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (this->m_errorCodes).
           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  }
  pRVar4 = (this->m_errorCodes).
           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->m_errorCodes).
                 super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4) / 0x38;
  iVar2 = (int)uVar3;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < iVar2) {
    uVar6 = uVar3 & 0xffffffff;
  }
  do {
    if (uVar6 == uVar5) {
      return (long)uVar5 < (long)iVar2;
    }
    uVar5 = uVar5 + 1;
    pGVar1 = &pRVar4->errorCode;
    pRVar4 = pRVar4 + 1;
  } while (*pGVar1 != errorCode);
  return true;
}

Assistant:

bool ValidStatusCodes::isErrorCodeValid (glw::GLenum errorCode) const
{
	if (errorCode == GL_NO_ERROR)
		return m_errorCodes.empty();
	else
	{
		// rule violation exists?
		for (int ndx = 0; ndx < (int)m_errorCodes.size(); ++ndx)
		{
			if (m_errorCodes[ndx].errorCode == errorCode)
				return true;
		}
		return false;
	}
}